

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

RepeatedFieldAccessor * __thiscall
google::protobuf::Reflection::RepeatedFieldAccessor(Reflection *this,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  FieldDescriptor *in_RSI;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  LogMessage *in_stack_ffffffffffffff30;
  LogMessage *this_00;
  undefined8 in_stack_ffffffffffffff38;
  LogLevel_conflict level;
  LogMessage *in_stack_ffffffffffffff40;
  LogMessage local_a0;
  byte local_51;
  FieldDescriptor *local_18;
  RepeatedFieldAccessor *local_8;
  
  level = (LogLevel_conflict)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_18 = in_RSI;
  bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x426e64);
  local_51 = 0;
  if (!bVar1) {
    internal::LogMessage::LogMessage
              (in_stack_ffffffffffffff40,level,(char *)in_stack_ffffffffffffff30,
               in_stack_ffffffffffffff2c);
    local_51 = 1;
    internal::LogMessage::operator<<
              (in_stack_ffffffffffffff30,
               (char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_ffffffffffffff30,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x426ee3);
  }
  CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x426ef0);
  switch((LogMessage *)(ulong)(CVar2 - CPPTYPE_INT32)) {
  case (LogMessage *)0x0:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    break;
  case (LogMessage *)0x1:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<long>>();
    break;
  case (LogMessage *)0x2:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_int>>
                        ();
    break;
  case (LogMessage *)0x3:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<unsigned_long>>
                        ();
    break;
  case (LogMessage *)0x4:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<double>>();
    break;
  case (LogMessage *)0x5:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<float>>();
    break;
  case (LogMessage *)0x6:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<bool>>();
    break;
  case (LogMessage *)0x7:
    local_8 = (RepeatedFieldAccessor *)
              (anonymous_namespace)::
              GetSingleton<google::protobuf::internal::RepeatedFieldPrimitiveAccessor<int>>();
    break;
  case (LogMessage *)0x8:
    FieldDescriptor::options(local_18);
    FieldOptions::ctype((FieldOptions *)0x426fe8);
    local_8 = (RepeatedFieldAccessor *)
              anon_unknown_0::
              GetSingleton<google::protobuf::internal::RepeatedPtrFieldStringAccessor>();
    break;
  case (LogMessage *)0x9:
    bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_ffffffffffffff30);
    if (bVar1) {
      local_8 = (RepeatedFieldAccessor *)
                anon_unknown_0::GetSingleton<google::protobuf::internal::MapFieldAccessor>();
    }
    else {
      local_8 = (RepeatedFieldAccessor *)
                anon_unknown_0::
                GetSingleton<google::protobuf::internal::RepeatedPtrFieldMessageAccessor>();
    }
    break;
  default:
    this_00 = &local_a0;
    internal::LogMessage::LogMessage
              ((LogMessage *)(ulong)(CVar2 - CPPTYPE_INT32),level,(char *)this_00,
               in_stack_ffffffffffffff2c);
    internal::LogMessage::operator<<
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
    internal::LogMessage::~LogMessage((LogMessage *)0x427089);
    local_8 = (RepeatedFieldAccessor *)0x0;
  }
  return local_8;
}

Assistant:

const internal::RepeatedFieldAccessor* Reflection::RepeatedFieldAccessor(
    const FieldDescriptor* field) const {
  GOOGLE_CHECK(field->is_repeated());
  switch (field->cpp_type()) {
#define HANDLE_PRIMITIVE_TYPE(TYPE, type) \
  case FieldDescriptor::CPPTYPE_##TYPE:   \
    return GetSingleton<internal::RepeatedFieldPrimitiveAccessor<type> >();
    HANDLE_PRIMITIVE_TYPE(INT32, int32)
    HANDLE_PRIMITIVE_TYPE(UINT32, uint32)
    HANDLE_PRIMITIVE_TYPE(INT64, int64)
    HANDLE_PRIMITIVE_TYPE(UINT64, uint64)
    HANDLE_PRIMITIVE_TYPE(FLOAT, float)
    HANDLE_PRIMITIVE_TYPE(DOUBLE, double)
    HANDLE_PRIMITIVE_TYPE(BOOL, bool)
    HANDLE_PRIMITIVE_TYPE(ENUM, int32)
#undef HANDLE_PRIMITIVE_TYPE
    case FieldDescriptor::CPPTYPE_STRING:
      switch (field->options().ctype()) {
        default:
        case FieldOptions::STRING:
          return GetSingleton<internal::RepeatedPtrFieldStringAccessor>();
      }
      break;
    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (field->is_map()) {
        return GetSingleton<internal::MapFieldAccessor>();
      } else {
        return GetSingleton<internal::RepeatedPtrFieldMessageAccessor>();
      }
  }
  GOOGLE_LOG(FATAL) << "Should not reach here.";
  return NULL;
}